

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

string * __thiscall
args::EitherFlag::str
          (string *__return_storage_ptr__,EitherFlag *this,string *shortPrefix,string *longPrefix)

{
  bool bVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_38 [2];
  long local_28 [2];
  
  bVar1 = this->isShort;
  if (bVar1 == true) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct((ulong)local_38,'\x01');
    plVar3 = (long *)std::__cxx11::string::replace
                               ((ulong)local_38,0,(char *)0x0,(ulong)(shortPrefix->_M_dataplus)._M_p
                               );
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  else {
    std::operator+(__return_storage_ptr__,longPrefix,&this->longFlag);
  }
  if ((bVar1 != false) && (local_38[0] != local_28)) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str(const std::string &shortPrefix, const std::string &longPrefix) const
        {
            return isShort ? shortPrefix + std::string(1, shortFlag) : longPrefix + longFlag;
        }